

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O3

type __thiscall
itlib::
flat_map<Rml::RenderManager*,Rml::CallbackTexture,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>>
::operator[]<Rml::RenderManager*>
          (flat_map<Rml::RenderManager*,Rml::CallbackTexture,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>>
           *this,RenderManager **k)

{
  iterator __position;
  UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  local_28;
  
  __position = lower_bound<Rml::RenderManager*>(this,k);
  if ((__position._M_current == *(pair<Rml::RenderManager_*,_Rml::CallbackTexture> **)(this + 8)) ||
     (*k < (__position._M_current)->first)) {
    local_28.render_manager = (RenderManager *)0x0;
    local_28.resource_handle = Invalid;
    local_28._12_4_ = 0;
    __position._M_current =
         (pair<Rml::RenderManager_*,_Rml::CallbackTexture> *)
         std::
         vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>
         ::_M_emplace_aux<Rml::RenderManager*,Rml::CallbackTexture>
                   ((vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>
                     *)this,__position._M_current,k,(CallbackTexture *)&local_28);
    Rml::
    UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::~UniqueRenderResource(&local_28);
  }
  return &(__position._M_current)->second;
}

Assistant:

typename std::enable_if<std::is_constructible<key_type, K>::value,
    mapped_type&>::type operator[](K&& k)
    {
        auto i = lower_bound(k);
        if (i != end() && !cmp()(k, *i))
        {
            return i->second;
        }

        i = m_container.emplace(i, std::forward<K>(k), mapped_type());
        return i->second;
    }